

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

void fmp4_stream::gen_splice_insert
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_splice_insert,
               int event_id,uint32_t duration,bool splice_immediate)

{
  byte bVar1;
  int iVar2;
  ulong uVar4;
  uint uVar5;
  pointer puVar6;
  pointer puVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> trailer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  pointer puVar3;
  
  base64_decode(&local_48,(string *)base64splice_insert_abi_cxx11_);
  puVar6 = (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((puVar6 != (pointer)0x0) &&
     (operator_delete(puVar6,(long)puVar3 - (long)puVar6),
     local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  puVar6 = (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (splice_immediate) {
    puVar6[2] = puVar6[2] + 0xff;
    puVar6[0xc] = puVar6[0xc] + 0xff;
    *(uint *)(puVar6 + 0xe) =
         (uint)event_id >> 0x18 | (event_id & 0xff0000U) >> 8 | (event_id & 0xff00U) << 8 |
         event_id << 0x18;
    bVar1 = puVar6[0x13];
    puVar6[0x13] = bVar1 | 0x10;
    if ((bVar1 & 0x40) != 0) {
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uchar *)0x0;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (uchar *)0x0;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
      puVar6 = (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)puVar6 - (long)puVar3) < 0xffffffffffffffea) {
        puVar7 = (pointer)0x15;
        do {
          if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
                       (iterator)
                       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,puVar7 + (long)puVar6);
          }
          else {
            *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = puVar7[(long)puVar6];
            local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar7 = puVar7 + 1;
          puVar6 = (out_splice_insert->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = (out_splice_insert->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        } while (puVar7 < puVar3 + ~(ulong)puVar6);
      }
      iVar2 = (int)puVar3;
      uVar5 = (uint)puVar6;
      if ((bVar1 & 0x20) != 0) {
        *(uint32_t *)
         (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + 1) =
             duration >> 0x18 | (duration & 0xff0000) >> 8 | (duration & 0xff00) << 8 |
             duration << 0x18;
      }
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar4 = 0;
        do {
          (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
          _M_impl.super__Vector_impl_data._M_start[uVar4 + 0x14] =
               local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 < (ulong)((long)local_48.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_48.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
        uVar5 = (uint)(out_splice_insert->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        iVar2 = (int)(out_splice_insert->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (out_splice_insert,(long)(int)(~uVar5 + iVar2));
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (uchar *)0x0) {
        return;
      }
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      return;
    }
  }
  else {
    *(uint *)(puVar6 + 0xe) =
         (uint)event_id >> 0x18 | (event_id & 0xff0000U) >> 8 | (event_id & 0xff00U) << 8 |
         event_id << 0x18;
    bVar1 = puVar6[0x13];
    puVar6[0x13] = bVar1 & 0xef;
  }
  if ((bVar1 & 0x20) != 0) {
    *(uint32_t *)(puVar6 + 0x16) =
         duration >> 0x18 | (duration & 0xff0000) >> 8 | (duration & 0xff00) << 8 | duration << 0x18
    ;
  }
  return;
}

Assistant:

void gen_splice_insert(std::vector<uint8_t> &out_splice_insert,int event_id, uint32_t duration, bool splice_immediate)
	{
		out_splice_insert = base64_decode(base64splice_insert);

		uint8_t *ptr = &out_splice_insert[0];
		if (splice_immediate)
		{
			*(ptr + 2) = *(ptr + 2) - 1;
		}

		ptr += 12;
		
		if (splice_immediate)
		{
			*(ptr ) = *(ptr) - 1;
		}

		ptr += 2;
		fmp4_write_uint32(event_id, (char *)ptr);
		ptr += 5;
		
		std::bitset<8> b2(*ptr);
		bool out_of_network_indicator = b2[7];
		bool program_splice_flag = b2[6];
		bool duration_flag = b2[5];
		bool splice_immediate_flag = b2[4];
		b2[4] = splice_immediate;
		*ptr = (unsigned char)b2.to_ulong();
		
		if (program_splice_flag && splice_immediate)
		{
			std::vector<uint8_t> trailer;
			for (int k = 21; k < out_splice_insert.size() - 1; k++)
			{
				trailer.push_back(out_splice_insert[k]);
			}
			ptr = &trailer[0];
			ptr++;
			if (duration_flag)
			{
				fmp4_write_uint32(duration, (const char*)ptr);
				ptr += 4;
			}
			for (int k = 0; k < trailer.size(); k++)
			{
				out_splice_insert[k + 20] = trailer[k];
			}
			int32_t or_size = out_splice_insert.size();
			out_splice_insert.resize(or_size - 1);
			return;
		}
		
		ptr+=3;
	
		if (duration_flag)
		{
			fmp4_write_uint32(duration, (const char *)ptr);
			ptr += 4;
		}
	
		//uint32_t crc = 0;
		//crc32_fmp4(&out_splice_insert[0], out_splice_insert.size() - 4, &crc);

		//ptr = &out_splice_insert[out_splice_insert.size() - 4];
		//fmp4_write_uint32(crc, (const char*)ptr);
		//uint32_t table[256];
		//crc::crc32::generate_table(table);

		//char* ptr2 = (char*)&out_splice_insert[0];
		//uint16_t slen = out_splice_insert.size() - 4;
		//printf("Size of Data struct is: %u\n", slen);                 // 16 bytes

		//uint32_t CRC = 0;
		//for (int cnt = 0; cnt < slen; cnt++) {
		//	CRC = crc::crc32::update(table, CRC, ptr2, 1);
		//	ptr2++;
		//}
		//// get the original crc
		//uint32_t or_crc = fmp4_read_uint32(ptr2);
		////fmp4_write_uint32(CRC, (char*)ptr2);
		//printf("Piece-wise crc32 of struct Data is: 0x%X \n", CRC);
	}